

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O2

MPP_RET put_frame(Kmpp *ctx,MppFrame frame)

{
  int iVar1;
  RK_S32 RVar2;
  MPP_RET MVar3;
  MppBuffer buffer;
  MppMeta meta;
  MPP_RET MVar4;
  RK_U32 local_130;
  RK_U32 local_12c;
  RK_U32 local_128;
  RK_U32 local_124;
  RK_U32 local_120;
  RK_U32 local_11c;
  RK_U32 local_118;
  MppFrameFormat local_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  MppEncROICfg *roi_data;
  MppPacket packet;
  MppEncROICfgLegacy roi_data0;
  
  if (ctx == (Kmpp *)0x0) {
    MVar4 = MPP_ERR_VALUE;
  }
  else if (ctx->mInitDone == 0) {
    MVar4 = MPP_ERR_INIT;
  }
  else {
    buffer = mpp_frame_get_buffer(frame);
    local_110 = 0;
    uStack_108 = 0;
    local_100 = 0;
    uStack_f8 = 0;
    local_f0 = 0;
    uStack_e8 = 0;
    local_e0 = 0;
    uStack_d8 = 0;
    local_d0 = 0;
    uStack_c8 = 0;
    local_c0 = 0;
    local_130 = mpp_frame_get_width(frame);
    local_12c = mpp_frame_get_height(frame);
    local_128 = mpp_frame_get_hor_stride(frame);
    local_124 = mpp_frame_get_ver_stride(frame);
    local_120 = mpp_frame_get_hor_stride_pixel(frame);
    local_11c = mpp_frame_get_offset_x(frame);
    local_118 = mpp_frame_get_offset_y(frame);
    local_114 = mpp_frame_get_fmt(frame);
    iVar1 = mpp_buffer_get_fd_with_caller(buffer,"put_frame");
    local_110 = CONCAT44(local_110._4_4_,iVar1);
    RVar2 = mpp_frame_has_meta(frame);
    if (RVar2 != 0) {
      meta = mpp_frame_get_meta(frame);
      packet = (MppPacket)0x0;
      mpp_meta_get_packet(meta,KEY_OUTPUT_PACKET,&packet);
      ctx->mPacket = packet;
      roi_data = (MppEncROICfg *)0x0;
      mpp_meta_get_ptr(meta,KEY_ROI_DATA,&roi_data);
      if (roi_data != (MppEncROICfg *)0x0) {
        roi_data0.change = 1;
        roi_data0.number = roi_data->number;
        memcpy(roi_data0.regions,roi_data->regions,(ulong)roi_data0.number << 4);
        (*ctx->mApi->control)(ctx,MPP_ENC_SET_ROI_CFG,&roi_data0);
      }
    }
    MVar3 = mpp_vcodec_ioctl(ctx->mClientFd,0x400,0,0x78,&local_130);
    MVar4 = MPP_OK;
    if (MVar3 != MPP_OK) {
      _mpp_log_l(2,"kmpp","chan %d VCODEC_CHAN_IN_FRM_RDY failed\n",(char *)0x0,
                 (ulong)(uint)ctx->mChanId);
      MVar4 = MVar3;
    }
  }
  return MVar4;
}

Assistant:

static MPP_RET put_frame(Kmpp *ctx, MppFrame frame)
{
    KmppFrameInfos frame_info;
    MppBuffer buf = NULL;
    MPP_RET ret = MPP_OK;

    if (!ctx)
        return MPP_ERR_VALUE;

    if (!ctx->mInitDone)
        return MPP_ERR_INIT;

    buf = mpp_frame_get_buffer(frame);
    memset(&frame_info, 0, sizeof(frame_info));
    frame_info.width = mpp_frame_get_width(frame);
    frame_info.height = mpp_frame_get_height(frame);
    frame_info.hor_stride = mpp_frame_get_hor_stride(frame);
    frame_info.ver_stride = mpp_frame_get_ver_stride(frame);
    frame_info.hor_stride_pixel = mpp_frame_get_hor_stride_pixel(frame);
    frame_info.offset_x = mpp_frame_get_offset_x(frame);
    frame_info.offset_y = mpp_frame_get_offset_y(frame);
    frame_info.fmt = mpp_frame_get_fmt(frame);
    frame_info.fd = mpp_buffer_get_fd(buf);
    // frame_info.pts = mpp_frame_get_pts(frame);
    // frame_info.jpeg_chan_id = mpp_frame_get_jpege_chan_id(frame);
    // frame_info.eos = mpp_frame_get_eos(frame);
    // frame_info.pskip = mpp_frame_get_pskip_request(frame);
    // frame_info.pskip_num = mpp_frame_get_pskip_num(frame);
    if (mpp_frame_has_meta(frame)) {
        MppMeta meta = mpp_frame_get_meta(frame);
        MppPacket packet = NULL;

        mpp_meta_get_packet(meta, KEY_OUTPUT_PACKET, &packet);
        ctx->mPacket = packet;

        /* set roi */
        {
            MppEncROICfg *roi_data = NULL;
            MppEncROICfgLegacy roi_data0;

            mpp_meta_get_ptr(meta, KEY_ROI_DATA, (void**)&roi_data);
            if (roi_data) {
                roi_data0.change = 1;
                roi_data0.number = roi_data->number;
                memcpy(roi_data0.regions, roi_data->regions, roi_data->number * sizeof(MppEncROIRegion));
                ctx->mApi->control(ctx, MPP_ENC_SET_ROI_CFG, &roi_data0);
            }
        }
    }

    ret = mpp_vcodec_ioctl(ctx->mClientFd, VCODEC_CHAN_IN_FRM_RDY, 0, sizeof(frame_info), &frame_info);
    if (ret)
        mpp_err("chan %d VCODEC_CHAN_IN_FRM_RDY failed\n", ctx->mChanId);

    return ret;
}